

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::XmlWriter(XmlWriter *this,ostream *os)

{
  undefined8 in_RSI;
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1d202c);
  std::__cxx11::string::string((string *)(in_RDI + 0x20));
  *(undefined8 *)(in_RDI + 0x40) = in_RSI;
  std::operator<<(*(ostream **)(in_RDI + 0x40),"<?xml version=\"1.1\" encoding=\"UTF-8\"?>\n");
  return;
}

Assistant:

XmlWriter( std::ostream& os )
        :   m_tagIsOpen( false ),
            m_needsNewline( false ),
            m_os( &os )
        {
            *m_os << "<?xml version=\"1.1\" encoding=\"UTF-8\"?>\n";
        }